

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O1

void av1_visit_palette(AV1Decoder *pbi,MACROBLOCKD *xd,aom_reader *r,palette_visitor_fn_t visit)

{
  long lVar1;
  bool bVar2;
  
  if ((((*xd->mi)->field_0xa7 & 0x80) == 0) && ((*xd->mi)->ref_frame[0] < '\x01')) {
    lVar1 = 0;
    do {
      if (((lVar1 == 0) || (xd->is_chroma_ref == true)) &&
         (((*xd->mi)->palette_mode_info).palette_size[lVar1] != '\0')) {
        (*visit)(xd,(int)lVar1,r);
      }
    } while ((((pbi->common).seq_params)->monochrome == '\0') &&
            (bVar2 = lVar1 == 0, lVar1 = lVar1 + 1, bVar2));
  }
  return;
}

Assistant:

void av1_visit_palette(AV1Decoder *const pbi, MACROBLOCKD *const xd,
                       aom_reader *r, palette_visitor_fn_t visit) {
  if (!is_inter_block(xd->mi[0])) {
    for (int plane = 0; plane < AOMMIN(2, av1_num_planes(&pbi->common));
         ++plane) {
      if (plane == 0 || xd->is_chroma_ref) {
        if (xd->mi[0]->palette_mode_info.palette_size[plane])
          visit(xd, plane, r);
      } else {
        assert(xd->mi[0]->palette_mode_info.palette_size[plane] == 0);
      }
    }
  }
}